

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void clip_image_f32_free(clip_image_f32 *img)

{
  if (img != (clip_image_f32 *)0x0) {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&(img->buf).super__Vector_base<float,_std::allocator<float>_>);
    operator_delete(img,0x20);
    return;
  }
  return;
}

Assistant:

void clip_image_f32_free(struct clip_image_f32 * img) { if (img) delete img; }